

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O0

vector<int,_std::allocator<int>_> *
mxx::scatter_recv<int>
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,size_t size,int root,comm *comm
          )

{
  size_t size_00;
  reference out;
  allocator<int> local_2a;
  undefined1 local_29;
  comm *local_28;
  comm *comm_local;
  size_t sStack_18;
  int root_local;
  size_t size_local;
  vector<int,_std::allocator<int>_> *result;
  
  local_29 = 0;
  local_28 = comm;
  comm_local._4_4_ = root;
  sStack_18 = size;
  size_local = (size_t)__return_storage_ptr__;
  std::allocator<int>::allocator(&local_2a);
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,size,&local_2a);
  std::allocator<int>::~allocator(&local_2a);
  size_00 = sStack_18;
  out = std::vector<int,_std::allocator<int>_>::operator[](__return_storage_ptr__,0);
  scatter<int>((int *)0x0,size_00,out,comm_local._4_4_,local_28);
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> scatter_recv(size_t size, int root, const mxx::comm& comm = mxx::comm()) {
    std::vector<T> result(size);
    scatter((const T*)nullptr, size, &result[0], root, comm);
    return result;
}